

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_mesh.cxx
# Opt level: O1

bool __thiscall
level_mesh::check_regular_regular_contacts
          (level_mesh *this,AABBTreeCollider *tc,b_submesh *sm,b_submesh *sm1)

{
  uint uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  udword *puVar4;
  pointer pbVar5;
  long lVar6;
  bool bVar7;
  bool bVar8;
  uint uVar9;
  uint uVar10;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *ids;
  long lVar11;
  ulong uVar12;
  long lVar13;
  
  uVar1 = (tc->mPairs).mCurNbEntries;
  if (uVar1 < 2) {
    __assert_fail("tc.GetNbPairs()",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/utils/converter/level_mesh.cxx"
                  ,0x2ce,
                  "bool level_mesh::check_regular_regular_contacts(const Opcode::AABBTreeCollider &, const b_submesh *, const b_submesh *) const"
                 );
  }
  uVar12 = (ulong)(uVar1 >> 1);
  if (this->m_restricted_merge == true) {
    puVar4 = (tc->mPairs).mEntries;
    uVar2 = (sm->super_b_model_instance).min_face;
    pbVar5 = (this->super_xr_mesh_builder).m_faces.
             super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar3 = (sm1->super_b_model_instance).min_face;
    if (*(short *)&pbVar5[*puVar4 + uVar2].field_1 == *(short *)&pbVar5[puVar4[1] + uVar3].field_1)
    {
      lVar11 = uVar12 * 8 + -8;
      lVar6 = 0;
      do {
        lVar13 = lVar6;
        if (lVar11 == lVar13) {
          return true;
        }
        lVar6 = lVar13 + 8;
      } while (*(short *)&pbVar5[*(int *)((long)puVar4 + lVar13 + 8) + uVar2].field_1 ==
               *(short *)&pbVar5[*(int *)((long)puVar4 + lVar13 + 0xc) + uVar3].field_1);
      if (lVar11 == lVar13) {
        return true;
      }
    }
  }
  else {
    puVar4 = (tc->mPairs).mEntries;
    if (this->m_aggressive_merge != true) {
      uVar2 = (sm->super_b_model_instance).min_face;
      pbVar5 = (this->super_xr_mesh_builder).m_faces.
               super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar3 = (sm1->super_b_model_instance).min_face;
      if (*(short *)&pbVar5[*puVar4 + uVar2].field_1 == *(short *)&pbVar5[puVar4[1] + uVar3].field_1
         ) {
        return true;
      }
      lVar11 = 0;
      do {
        bVar8 = uVar12 * 8 + -8 == lVar11;
        bVar7 = !bVar8;
        if (bVar8) {
          return bVar7;
        }
        lVar6 = lVar11 + 8;
        lVar13 = lVar11 + 0xc;
        lVar11 = lVar11 + 8;
      } while (*(short *)&pbVar5[*(int *)((long)puVar4 + lVar6) + uVar2].field_1 !=
               *(short *)&pbVar5[*(int *)((long)puVar4 + lVar13) + uVar3].field_1);
      return bVar7;
    }
    uVar2 = (sm->super_b_model_instance).min_face;
    uVar1 = (sm->super_b_model_instance).max_face;
    pbVar5 = (this->super_xr_mesh_builder).m_faces.
             super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ids = &this->m_inadhesive_shaders;
    uVar9 = *puVar4 + uVar2;
    if (uVar1 <= uVar9) {
      uVar9 = uVar1;
    }
    bVar7 = check_match(ids,*(uint16_t *)((long)&pbVar5[(int)uVar9].field_1 + 2));
    if (!bVar7) {
      uVar3 = (sm1->super_b_model_instance).min_face;
      uVar9 = (sm1->super_b_model_instance).max_face;
      lVar11 = 8;
      bVar7 = false;
      do {
        uVar10 = *(int *)((long)puVar4 + lVar11 + -4) + uVar3;
        if (uVar9 <= uVar10) {
          uVar10 = uVar9;
        }
        bVar8 = check_match(ids,*(uint16_t *)((long)&pbVar5[(int)uVar10].field_1 + 2));
        if (bVar8) break;
        bVar7 = uVar12 << 3 == lVar11;
        if (bVar7) {
          return true;
        }
        uVar10 = *(int *)((long)puVar4 + lVar11) + uVar2;
        if (uVar1 <= uVar10) {
          uVar10 = uVar1;
        }
        bVar8 = check_match(ids,*(uint16_t *)((long)&pbVar5[(int)uVar10].field_1 + 2));
        lVar11 = lVar11 + 8;
      } while (!bVar8);
      if (bVar7) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool level_mesh::check_regular_regular_contacts(const Opcode::AABBTreeCollider& tc,
		const b_submesh* sm, const b_submesh* sm1) const
{
	xr_assert(tc.GetNbPairs());
	if (m_restricted_merge) {
		for (const Pair *pair = tc.GetPairs(), *end = pair + tc.GetNbPairs(); pair != end; ++pair) {
			const b_face& face = m_faces[pair->id0 + sm->min_face];
			const b_face& face1 = m_faces[pair->id1 + sm1->min_face];
			if (face.surface.texture != face1.surface.texture)
				return false;
		}
	} else if (m_aggressive_merge) {
		for (const Pair *pair = tc.GetPairs(), *end = pair + tc.GetNbPairs(); pair != end; ++pair) {

			int index = pair->id0 + sm->min_face;
			if (index > sm->max_face)// by // FIXME: hack to handle 1-face meshes
				index = sm->max_face;
			const b_face& face = m_faces[index];
			if (check_match(m_inadhesive_shaders, face.surface.eshader))
				return false;

			index = pair->id1 + sm1->min_face;
			if (index > sm1->max_face)// by // FIXME: hack to handle 1-face meshes
				index = sm1->max_face;

			const b_face& face1 = m_faces[index];
			if (check_match(m_inadhesive_shaders, face1.surface.eshader))
				return false;
		}
	} else {
		for (const Pair *pair = tc.GetPairs(), *end = pair + tc.GetNbPairs(); pair != end; ++pair) {
			const b_face& face = m_faces[pair->id0 + sm->min_face];
			const b_face& face1 = m_faces[pair->id1 + sm1->min_face];
			if (face.surface.texture == face1.surface.texture)
				return true;
		}
		return false;
	}
	return true;
}